

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasFlexibleShapes(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  ShapeFlexibilityCase SVar3;
  SizeFlexibilityCase SVar4;
  ModelDescription *this;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *other;
  reference this_00;
  FeatureType *pFVar5;
  ArrayFeatureType *this_01;
  ImageFeatureType *this_02;
  FeatureDescription *input;
  iterator __end1;
  RepeatedPtrIterator<CoreML::Specification::FeatureDescription> local_40;
  iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> inputs;
  Model *model_local;
  
  inputs.super_RepeatedPtrFieldBase.rep_ = (Rep *)model;
  this = Specification::Model::description(model);
  other = Specification::ModelDescription::input(this);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1,other);
  __begin1.it_ = (void **)&__range1;
  local_40.it_ = (void **)google::protobuf::
                          RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                                    ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                                     &__range1);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)__begin1.it_);
  do {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator!=
                      (&local_40,(iterator *)&input);
    if (!bVar1) {
      model_local._7_1_ = false;
LAB_00355acc:
      google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
      ~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)&__range1);
      return model_local._7_1_;
    }
    this_00 = google::protobuf::internal::
              RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::operator*(&local_40);
    pFVar5 = Specification::FeatureDescription::type(this_00);
    TVar2 = Specification::FeatureType::Type_case(pFVar5);
    if (TVar2 == kMultiArrayType) {
      pFVar5 = Specification::FeatureDescription::type(this_00);
      this_01 = Specification::FeatureType::multiarraytype(pFVar5);
      SVar3 = Specification::ArrayFeatureType::ShapeFlexibility_case(this_01);
      if (SVar3 != SHAPEFLEXIBILITY_NOT_SET) {
        model_local._7_1_ = true;
        goto LAB_00355acc;
      }
    }
    else {
      pFVar5 = Specification::FeatureDescription::type(this_00);
      TVar2 = Specification::FeatureType::Type_case(pFVar5);
      if (TVar2 == kImageType) {
        pFVar5 = Specification::FeatureDescription::type(this_00);
        this_02 = Specification::FeatureType::imagetype(pFVar5);
        SVar4 = Specification::ImageFeatureType::SizeFlexibility_case(this_02);
        if (SVar4 != SIZEFLEXIBILITY_NOT_SET) {
          model_local._7_1_ = true;
          goto LAB_00355acc;
        }
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription>::
    operator++(&local_40);
  } while( true );
}

Assistant:

bool CoreML::hasFlexibleShapes(const Specification::Model& model) {

    auto inputs = model.description().input();
    for (const auto& input: inputs) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            if (input.type().multiarraytype().ShapeFlexibility_case() != Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET) {
                return true;
            }
        }
        else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
            if (input.type().imagetype().SizeFlexibility_case() != Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET) {
                return true;
            }
        }
    }
    return false;
}